

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverLines.cpp
# Opt level: O2

void fillRow1<float>(Matrix<float,_6,_1,_0,_6,_1> *l01,Matrix<float,_6,_1,_0,_6,_1> *l02,
                    Matrix<float,_6,_1,_0,_6,_1> *l11,Matrix<float,_6,_1,_0,_6,_1> *l12,
                    vector<float,_std::allocator<float>_> *c0,
                    vector<float,_std::allocator<float>_> *c1,
                    vector<float,_std::allocator<float>_> *c2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  vector<float,_std::allocator<float>_> *this;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float local_c8;
  float local_c4;
  vector<float,_std::allocator<float>_> *local_c0;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_80;
  float local_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar12 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar17 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  fVar18 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  local_c8 = (fVar17 * fVar6 * fVar5 +
             ((fVar12 * fVar17 * fVar4 + (fVar1 * fVar2 * fVar5 - fVar3 * fVar1 * fVar4)) -
             fVar2 * fVar12 * fVar18)) - fVar3 * fVar6 * fVar18;
  local_c0 = c1;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(c0,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  local_c8 = (fVar1 + fVar1) *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] * fVar4 +
             fVar1 * -2.0 * fVar3 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] +
             (fVar2 + fVar2) * fVar3 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] +
             fVar2 * -2.0 *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] * fVar4;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(c0,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar12 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar17 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  fVar18 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  local_c8 = fVar3 * fVar6 * fVar18 +
             ((fVar2 * fVar12 * fVar18 +
              ((fVar1 * fVar2 * fVar5 - fVar3 * fVar1 * fVar4) - fVar17 * fVar12 * fVar4)) -
             fVar17 * fVar6 * fVar5);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(c0,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar3 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  local_c8 = fVar3 * -2.0 *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] * fVar4 +
             (fVar3 + fVar3) * fVar2 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] +
             (fVar1 + fVar1) *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2] * fVar4 +
             fVar1 * -2.0 * fVar2 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(c0,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar3 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar4 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  local_c8 = fVar1 * -2.0 * fVar4 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] +
             (fVar1 + fVar1) *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] * fVar3 +
             fVar2 * -2.0 *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2] * fVar3 +
             (fVar2 + fVar2) * fVar4 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(c0,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar12 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar17 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  fVar18 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  local_c8 = fVar3 * fVar6 * fVar18 +
             (((fVar12 * fVar17 * fVar4 + (fVar1 * fVar3 * fVar4 - fVar2 * fVar1 * fVar5)) -
              fVar2 * fVar12 * fVar18) - fVar17 * fVar6 * fVar5);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(c0,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar3 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar4 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  local_c8 = (fVar1 + fVar1) * fVar4 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] +
             fVar1 * -2.0 *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] * fVar3 +
             fVar2 * -2.0 *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2] * fVar3 +
             (fVar2 + fVar2) * fVar4 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(c0,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar3 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  local_c8 = fVar3 * -2.0 *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] * fVar4 +
             (fVar3 + fVar3) * fVar2 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] +
             fVar1 * -2.0 *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2] * fVar4 +
             (fVar1 + fVar1) * fVar2 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(c0,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  local_c8 = fVar1 * -2.0 *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] * fVar4 +
             (fVar1 + fVar1) * fVar3 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] +
             (fVar2 + fVar2) * fVar3 *
             (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] +
             fVar2 * -2.0 *
             (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] * fVar4;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(c0,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar12 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar17 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  fVar18 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  local_c8 = (fVar17 * fVar6 * fVar5 +
             fVar2 * fVar12 * fVar18 +
             ((fVar1 * fVar3 * fVar4 - fVar2 * fVar1 * fVar5) - fVar17 * fVar12 * fVar4)) -
             fVar3 * fVar6 * fVar18;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(c0,&local_c8);
  this = local_c0;
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar12 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar17 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  fVar18 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  local_c8 = (fVar17 * fVar6 * fVar5 +
             (((fVar1 * fVar3 * fVar4 + fVar1 * fVar2 * fVar5) - fVar17 * fVar12 * fVar4) -
             fVar2 * fVar12 * fVar18)) - fVar3 * fVar6 * fVar18;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(local_c0,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar4 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  local_c8 = (fVar1 + fVar1) * fVar3 * fVar5 +
             (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] * -2.0 * fVar4 * fVar5 +
             (fVar2 + fVar2) * fVar4 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] +
             fVar2 * -2.0 * fVar3 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0];
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(this,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar12 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar17 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  fVar18 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  local_c8 = fVar3 * fVar6 * fVar18 +
             fVar17 * fVar6 * fVar5 +
             fVar2 * fVar12 * fVar18 +
             ((-fVar1 * fVar3 * fVar4 - fVar1 * fVar2 * fVar5) - fVar17 * fVar12 * fVar4);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(this,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar4 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  local_c8 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] * -2.0 * fVar3 * fVar5 +
             (fVar1 + fVar1) * fVar3 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] +
             (fVar2 + fVar2) * fVar4 * fVar5 +
             fVar1 * -2.0 * fVar4 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(this,&local_c8);
  fVar1 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar3 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar4 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  local_c8 = fVar4 * -2.0 * fVar1 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] +
             (fVar4 + fVar4) * fVar2 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2] +
             (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2] * -2.0 * fVar2 * fVar3 + (fVar5 + fVar5) * fVar1 * fVar3;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(this,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar12 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar17 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  fVar18 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  local_c8 = ((fVar2 * fVar12 * fVar18 +
              fVar12 * fVar17 * fVar4 + (fVar1 * fVar3 * fVar4 - fVar2 * fVar1 * fVar5)) -
             fVar17 * fVar6 * fVar5) - fVar3 * fVar6 * fVar18;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(this,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0] * -2.0;
  local_c8 = fVar6 * fVar3 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] +
             fVar4 * fVar6 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2] + (fVar2 + fVar2) * fVar4 * fVar5 + (fVar1 + fVar1) * fVar3 * fVar5;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(this,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar2 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar4 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1] * -2.0;
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  local_c8 = (fVar1 + fVar1) * fVar3 * fVar5 +
             fVar6 * fVar3 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0] +
             (fVar2 + fVar2) * fVar4 * fVar5 +
             fVar4 * fVar6 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(this,&local_c8);
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2] * -2.0;
  fVar1 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar3 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar4 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  local_c8 = (fVar3 + fVar3) * fVar1 * fVar5 +
             (fVar4 + fVar4) * fVar2 * fVar5 +
             fVar6 * fVar2 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1] +
             fVar6 * fVar1 *
             (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0];
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(this,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar12 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar17 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  fVar18 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  local_c8 = fVar3 * fVar6 * fVar18 +
             (((fVar12 * fVar17 * fVar4 + (fVar1 * fVar2 * fVar5 - fVar3 * fVar1 * fVar4)) -
              fVar2 * fVar12 * fVar18) - fVar17 * fVar6 * fVar5);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(this,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar11 = fVar3 * -fVar1;
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  local_78._0_4_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  local_c4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1];
  local_98 = ZEXT416((uint)fVar1);
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  local_68._0_4_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  local_b0 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[5];
  fVar6 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  local_a8._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4];
  fVar12 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  fVar17 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  fVar7 = -fVar1 * fVar2;
  local_b4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0];
  local_b8 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[3];
  fVar18 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar20 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  fVar13 = fVar20 * -fVar18;
  fVar8 = -fVar18 * fVar2;
  fVar21 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar14 = fVar20 * -fVar21;
  fVar9 = -fVar21 * fVar3;
  local_c8 = fVar21 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[3] +
             (((fVar2 * (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage
                        .m_data.array[3] +
               (((fVar9 * local_b8 * fVar6 +
                 fVar3 * fVar21 * (float)local_a8._0_4_ * local_b4 +
                 fVar17 * fVar9 * local_c4 +
                 fVar5 * fVar3 * fVar21 * (float)local_78._0_4_ +
                 fVar14 * local_b8 * fVar12 +
                 fVar20 * fVar21 * local_b0 * local_b4 +
                 fVar17 * fVar14 * (float)local_68._0_4_ +
                 fVar4 * fVar20 * fVar21 * (float)local_78._0_4_ +
                 fVar8 * local_b8 * fVar6 +
                 fVar2 * fVar18 * (float)local_a8._0_4_ * local_b4 +
                 fVar17 * fVar8 * local_c4 +
                 fVar5 * fVar2 * fVar18 * (float)local_78._0_4_ +
                 fVar18 * fVar20 * (float)local_a8._0_4_ * fVar12 +
                 fVar13 * local_b0 * fVar6 +
                 fVar5 * fVar13 * (float)local_68._0_4_ +
                 fVar4 * fVar18 * fVar20 * local_c4 +
                 fVar7 * local_b8 * fVar12 +
                 fVar1 * fVar2 * local_b0 * local_b4 +
                 fVar7 * fVar17 * (float)local_68._0_4_ +
                 fVar4 * fVar1 * fVar2 * (float)local_78._0_4_ +
                 fVar11 * (float)local_a8._0_4_ * fVar12 +
                 fVar1 * fVar3 * local_b0 * fVar6 +
                 fVar11 * fVar4 * local_c4 + fVar1 * fVar3 * fVar5 * (float)local_68._0_4_) -
                fVar20 * (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).
                         m_storage.m_data.array[5]) -
               fVar3 * (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                       m_data.array[4])) -
              fVar1 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[5]) -
             fVar18 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[4]);
  local_c0._0_4_ = fVar6;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(c2,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  local_c4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[3];
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar6 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  local_c0._0_4_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1];
  fVar12 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [4];
  fVar17 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar16 = fVar17 + fVar17;
  fVar18 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  local_a8._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5];
  fVar20 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar21 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  fVar7 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar8 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  fVar15 = fVar3 * fVar17 * -2.0;
  fVar9 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  fVar11 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar13 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar10 = fVar13 + fVar13;
  fVar19 = fVar13 * -2.0 * fVar2;
  fVar14 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [4];
  local_c8 = fVar10 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[4] +
             fVar16 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[3] +
             (fVar8 + fVar8) * fVar3 +
             (fVar14 + fVar14) * fVar2 +
             fVar2 * fVar10 * fVar21 * fVar11 +
             fVar19 * fVar9 * fVar20 +
             local_c4 * fVar2 * fVar10 * local_c0._0_4_ +
             fVar12 * fVar19 * fVar6 +
             fVar18 * fVar13 * -2.0 * fVar9 * fVar7 +
             fVar18 * fVar10 * (float)local_a8._0_4_ * fVar11 +
             fVar15 * fVar21 * fVar11 +
             fVar3 * fVar16 * fVar9 * fVar20 +
             local_c4 * fVar15 * local_c0._0_4_ +
             fVar12 * fVar3 * fVar16 * fVar6 +
             fVar17 * -2.0 * fVar18 * fVar21 * fVar7 +
             fVar16 * fVar18 * (float)local_a8._0_4_ * fVar20 +
             fVar1 * -2.0 * fVar2 * fVar12 * fVar5 +
             (fVar1 + fVar1) * fVar2 * fVar4 * local_c0._0_4_ +
             (fVar1 + fVar1) * fVar3 * fVar4 * fVar6 + fVar1 * -2.0 * fVar3 * local_c4 * fVar5;
  local_98._0_4_ = fVar21;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(c2,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  local_68._0_4_ =
       (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  local_b4 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1];
  local_48._0_4_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5];
  local_b0 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0];
  local_c4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1];
  local_c0._0_4_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4];
  local_98._0_4_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  local_78 = ZEXT416((uint)fVar1);
  fVar12 = local_b4 * -fVar1;
  fVar2 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  local_a8._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1];
  local_b8 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[4];
  local_ac = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  fVar20 = -fVar1 * (float)local_68._0_4_;
  fVar3 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  local_80 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  fVar4 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  local_58 = ZEXT416((uint)fVar4);
  fVar17 = local_80 * -fVar4;
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  fVar6 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  local_7c = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[3];
  fVar7 = local_80 * -fVar3;
  fVar21 = -fVar3 * (float)local_68._0_4_;
  fVar18 = -fVar4 * local_b4;
  local_c8 = (fVar3 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[4] +
             (((local_b4 *
                (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
                array[4] +
               ((local_b4 * fVar4 * local_7c * (float)local_a8._0_4_ +
                fVar18 * local_b8 * fVar6 +
                fVar5 * local_b4 * fVar4 * local_c4 +
                local_c0._0_4_ * fVar18 * local_b0 +
                local_80 * fVar4 * local_7c * local_ac +
                fVar17 * fVar2 * fVar6 +
                fVar5 * fVar17 * (float)local_98._0_4_ +
                (float)local_48._0_4_ * local_80 * fVar4 * local_b0 +
                (float)local_68._0_4_ * fVar3 * local_7c * (float)local_a8._0_4_ +
                fVar21 * local_b8 * fVar6 +
                fVar5 * (float)local_68._0_4_ * fVar3 * local_c4 +
                local_c0._0_4_ * fVar21 * local_b0 +
                fVar7 * local_b8 * local_ac +
                fVar3 * local_80 * fVar2 * (float)local_a8._0_4_ +
                local_c0._0_4_ * fVar7 * (float)local_98._0_4_ +
                (float)local_48._0_4_ * fVar3 * local_80 * local_c4 +
                fVar20 * local_7c * local_ac +
                fVar2 * fVar1 * (float)local_68._0_4_ * fVar6 +
                fVar1 * (float)local_68._0_4_ * fVar5 * (float)local_98._0_4_ +
                (float)local_48._0_4_ * fVar20 * local_b0 +
                fVar12 * local_b8 * local_ac +
                fVar1 * local_b4 * fVar2 * (float)local_a8._0_4_ +
                fVar1 * local_b4 * (float)local_48._0_4_ * local_c4 +
                fVar12 * local_c0._0_4_ * (float)local_98._0_4_) -
               local_80 *
               (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
               array[5])) -
              (float)local_68._0_4_ *
              (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[3]) -
             fVar1 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                     m_data.array[5])) -
             fVar4 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                     m_data.array[3];
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(c2,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar15 = fVar1 + fVar1;
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar3 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  local_c0._0_4_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  fVar16 = fVar1 * -2.0 * fVar2;
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  local_a8._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5];
  fVar6 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  local_98._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1];
  fVar12 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  fVar17 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  fVar18 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  local_c4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[4];
  fVar20 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar21 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [4];
  fVar7 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  fVar8 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar9 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar11 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar10 = fVar11 + fVar11;
  fVar14 = fVar11 * -2.0 * fVar9;
  fVar13 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [5];
  local_c8 = fVar10 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[5] +
             fVar15 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[3] +
             (fVar7 + fVar7) * fVar2 +
             (fVar13 + fVar13) * fVar9 +
             fVar9 * fVar10 * fVar12 * fVar17 +
             fVar14 * (float)local_a8._0_4_ * fVar6 +
             fVar4 * fVar9 * fVar10 * local_c0._0_4_ +
             fVar3 * fVar14 * fVar5 +
             fVar18 * fVar10 * local_c4 * fVar17 +
             fVar18 * fVar11 * -2.0 * (float)local_a8._0_4_ * (float)local_98._0_4_ +
             (fVar20 + fVar20) * fVar9 * fVar21 * local_c0._0_4_ +
             fVar20 * -2.0 * fVar9 * fVar3 * fVar8 +
             fVar2 * fVar20 * -2.0 * fVar4 * fVar8 +
             fVar2 * (fVar20 + fVar20) * fVar21 * fVar5 +
             fVar1 * -2.0 * fVar18 * fVar12 * (float)local_98._0_4_ +
             fVar15 * fVar18 * local_c4 * fVar6 +
             fVar16 * fVar12 * fVar17 +
             fVar15 * fVar2 * (float)local_a8._0_4_ * fVar6 +
             fVar15 * fVar2 * fVar3 * fVar5 + fVar16 * fVar4 * local_c0._0_4_;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(c2,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar14 = fVar1 + fVar1;
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar3 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  local_b8 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1];
  local_a8._0_4_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4];
  local_c0._0_4_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  fVar11 = fVar1 * -2.0 * fVar2;
  local_c4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[5];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar5 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar6 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  local_98._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  fVar12 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  local_b4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[3];
  fVar17 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar18 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar10 = fVar17 * -2.0 * fVar18;
  fVar20 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar13 = fVar17 + fVar17;
  fVar21 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [4];
  fVar7 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar8 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  fVar9 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  local_c8 = fVar13 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[5] +
             fVar14 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[4] +
             (fVar21 + fVar21) * fVar2 +
             (fVar9 + fVar9) * fVar18 +
             (fVar20 + fVar20) * fVar18 * fVar8 * local_c0._0_4_ +
             fVar20 * -2.0 * fVar18 * fVar3 * fVar7 +
             fVar2 * (fVar20 + fVar20) * fVar8 * local_b8 +
             fVar2 * fVar20 * -2.0 * (float)local_a8._0_4_ * fVar7 +
             fVar12 * fVar13 * local_b4 * (float)local_98._0_4_ +
             fVar17 * -2.0 * fVar12 * local_c4 * fVar4 +
             fVar13 * fVar18 * fVar6 * (float)local_98._0_4_ +
             fVar10 * local_c4 * fVar5 +
             (float)local_a8._0_4_ * fVar13 * fVar18 * local_c0._0_4_ +
             fVar3 * fVar10 * local_b8 +
             fVar14 * fVar12 * local_b4 * fVar5 +
             fVar1 * -2.0 * fVar12 * fVar6 * fVar4 +
             fVar11 * fVar6 * (float)local_98._0_4_ +
             fVar14 * fVar2 * local_c4 * fVar5 +
             fVar14 * fVar2 * fVar3 * local_b8 + fVar11 * (float)local_a8._0_4_ * local_c0._0_4_;
  local_78._0_4_ = fVar4;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(c2,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  local_ac = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0];
  local_c4 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1];
  fVar7 = local_c4 * -fVar1;
  fVar2 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  local_98._0_4_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  local_b8 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1];
  fVar3 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  local_68._0_4_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  local_b0 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[5];
  local_c0._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1];
  local_a8._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar18 = -fVar1 * local_ac;
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  local_78._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  local_b4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[3];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar12 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  fVar20 = fVar12 * -fVar6;
  fVar9 = -fVar6 * local_ac;
  fVar17 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar8 = fVar12 * -fVar17;
  fVar21 = -fVar17 * local_c4;
  local_c8 = ((fVar1 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                       m_data.array[5] +
              (((fVar12 * (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).
                          m_storage.m_data.array[5] +
                local_c4 * fVar17 * local_b4 * local_c0._0_4_ +
                fVar21 * (float)local_a8._0_4_ * (float)local_78._0_4_ +
                fVar5 * fVar21 * local_b8 +
                fVar3 * local_c4 * fVar17 * (float)local_98._0_4_ +
                fVar12 * fVar17 * local_b4 * fVar4 +
                fVar8 * local_b0 * (float)local_78._0_4_ +
                fVar5 * fVar12 * fVar17 * (float)local_68._0_4_ +
                fVar2 * fVar8 * (float)local_98._0_4_ +
                fVar9 * local_b4 * local_c0._0_4_ +
                local_ac * fVar6 * (float)local_a8._0_4_ * (float)local_78._0_4_ +
                fVar5 * local_ac * fVar6 * local_b8 +
                fVar3 * fVar9 * (float)local_98._0_4_ +
                fVar6 * fVar12 * (float)local_a8._0_4_ * fVar4 +
                fVar20 * local_b0 * local_c0._0_4_ +
                fVar3 * fVar6 * fVar12 * (float)local_68._0_4_ +
                fVar2 * fVar20 * local_b8 +
                fVar1 * local_ac * local_b4 * fVar4 +
                fVar18 * local_b0 * (float)local_78._0_4_ +
                fVar1 * local_ac * fVar5 * (float)local_68._0_4_ +
                fVar2 * fVar18 * (float)local_98._0_4_ +
                fVar1 * local_c4 * (float)local_a8._0_4_ * fVar4 +
                fVar7 * local_b0 * local_c0._0_4_ +
                fVar7 * fVar2 * local_b8 + fVar1 * local_c4 * fVar3 * (float)local_68._0_4_) -
               local_c4 *
               (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
               array[4]) -
              local_ac *
              (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
              array[3])) -
             fVar6 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                     m_data.array[4]) -
             fVar17 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[3];
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(c2,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar7 = fVar1 * -2.0 * fVar2;
  fVar3 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar11 = fVar1 + fVar1;
  local_a8._0_4_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4];
  local_c0._0_4_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  local_c4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[5];
  local_78._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  local_b0 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1];
  local_b4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[4];
  local_98._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  fVar5 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  local_b8 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[3];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar9 = fVar6 * -2.0;
  fVar12 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar17 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar8 = (fVar6 + fVar6) * fVar12;
  fVar18 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar20 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  fVar21 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [5];
  local_c8 = fVar9 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                     m_data.array[5] +
             fVar11 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[4] +
             (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[4] * -2.0 * fVar2 +
             (fVar21 + fVar21) * fVar12 +
             (fVar17 + fVar17) * fVar12 * fVar20 * local_c0._0_4_ +
             fVar17 * -2.0 * fVar12 * fVar3 * fVar18 +
             fVar2 * fVar17 * -2.0 * fVar20 * fVar4 +
             fVar2 * (fVar17 + fVar17) * (float)local_a8._0_4_ * fVar18 +
             fVar5 * fVar9 * local_b8 * (float)local_98._0_4_ +
             fVar5 * (fVar6 + fVar6) * local_c4 * (float)local_78._0_4_ +
             fVar9 * fVar12 * local_b4 * (float)local_98._0_4_ +
             fVar8 * local_c4 * local_b0 +
             (float)local_a8._0_4_ * fVar8 * local_c0._0_4_ +
             fVar3 * fVar9 * fVar12 * fVar4 +
             fVar11 * fVar5 * local_b8 * local_b0 +
             fVar1 * -2.0 * fVar5 * local_b4 * (float)local_78._0_4_ +
             fVar7 * local_b4 * (float)local_98._0_4_ +
             fVar11 * fVar2 * local_c4 * local_b0 +
             fVar7 * fVar3 * fVar4 + fVar11 * fVar2 * (float)local_a8._0_4_ * local_c0._0_4_;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(c2,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar15 = (fVar1 + fVar1) * fVar2;
  fVar3 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  local_c0._0_4_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  fVar14 = fVar1 * -2.0;
  local_c4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0];
  fVar5 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  fVar6 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  local_98._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1];
  fVar12 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  fVar17 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  fVar18 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  local_a8._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4];
  fVar20 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar21 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [4];
  fVar7 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  fVar8 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar9 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar11 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar10 = fVar11 + fVar11;
  fVar13 = fVar11 * -2.0 * fVar9;
  local_c8 = fVar10 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[5] +
             fVar14 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[3] +
             (fVar7 + fVar7) * fVar2 +
             (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[5] * -2.0 * fVar9 +
             fVar9 * fVar10 * fVar12 * fVar17 +
             fVar13 * fVar5 * fVar6 +
             fVar4 * fVar13 * local_c0._0_4_ +
             fVar3 * fVar9 * fVar10 * local_c4 +
             fVar18 * fVar10 * (float)local_a8._0_4_ * fVar17 +
             fVar18 * fVar11 * -2.0 * fVar5 * (float)local_98._0_4_ +
             fVar20 * -2.0 * fVar9 * fVar21 * local_c0._0_4_ +
             (fVar20 + fVar20) * fVar9 * fVar3 * fVar8 +
             fVar2 * fVar20 * -2.0 * fVar4 * fVar8 +
             fVar2 * (fVar20 + fVar20) * fVar21 * local_c4 +
             (fVar1 + fVar1) * fVar18 * fVar12 * (float)local_98._0_4_ +
             fVar14 * fVar18 * (float)local_a8._0_4_ * fVar6 +
             fVar15 * fVar12 * fVar17 +
             fVar14 * fVar2 * fVar5 * fVar6 +
             fVar15 * fVar3 * local_c4 + fVar14 * fVar2 * fVar4 * local_c0._0_4_;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(c2,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar3 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  fVar4 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  fVar5 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  fVar6 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar12 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  local_c0._0_4_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1];
  fVar17 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [4];
  fVar18 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar14 = fVar18 + fVar18;
  fVar20 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [2];
  local_a8._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5];
  fVar21 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar7 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [3];
  local_c4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  fVar15 = fVar3 * fVar18 * -2.0;
  fVar8 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  fVar16 = fVar8 * -2.0;
  fVar9 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [4];
  fVar11 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [1];
  fVar10 = (fVar8 + fVar8) * fVar2;
  fVar13 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [4];
  local_c8 = fVar16 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[4] +
             fVar14 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                      m_data.array[3] +
             (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[3] * -2.0 * fVar3 +
             (fVar13 + fVar13) * fVar2 +
             fVar2 * fVar16 * fVar7 * fVar11 +
             fVar10 * fVar9 * fVar21 +
             fVar5 * fVar10 * local_c0._0_4_ +
             fVar17 * fVar2 * fVar16 * fVar12 +
             fVar20 * (fVar8 + fVar8) * fVar9 * local_c4 +
             fVar20 * fVar16 * (float)local_a8._0_4_ * fVar11 +
             fVar15 * fVar7 * fVar11 +
             fVar3 * fVar14 * fVar9 * fVar21 +
             fVar5 * fVar3 * fVar14 * local_c0._0_4_ +
             fVar17 * fVar15 * fVar12 +
             fVar18 * -2.0 * fVar20 * fVar7 * local_c4 +
             fVar14 * fVar20 * (float)local_a8._0_4_ * fVar21 +
             fVar1 * -2.0 * fVar2 * fVar17 * fVar6 +
             (fVar1 + fVar1) * fVar2 * fVar4 * local_c0._0_4_ +
             fVar1 * -2.0 * fVar3 * fVar4 * fVar12 + (fVar1 + fVar1) * fVar3 * fVar5 * fVar6;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(c2,&local_c8);
  fVar1 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  fVar2 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  local_c4 = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[1];
  local_ac = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[5];
  local_98._0_4_ =
       (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1];
  local_b0 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[4];
  local_80 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  local_a8 = ZEXT416((uint)fVar1);
  fVar20 = local_c4 * -fVar1;
  fVar3 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [5];
  local_78._0_4_ =
       (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1];
  local_b4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[4];
  fVar4 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [2];
  local_c0 = (vector<float,_std::allocator<float>_> *)CONCAT44(local_c0._4_4_,fVar2);
  local_b8 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[0];
  fVar11 = -fVar1 * fVar2;
  fVar5 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [1];
  local_7c = (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[2];
  fVar6 = (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
          [0];
  local_48 = ZEXT416((uint)fVar6);
  fVar12 = (l02->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  fVar17 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [0];
  fVar18 = (l01->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3];
  local_58._0_4_ = fVar4;
  local_68 = ZEXT416((uint)fVar5);
  fVar7 = local_7c * -fVar5;
  fVar9 = -fVar5 * fVar2;
  fVar21 = local_7c * -fVar6;
  fVar8 = -fVar6 * local_c4;
  local_c8 = fVar6 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                     m_data.array[3] +
             fVar5 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                     m_data.array[4] +
             fVar1 * (l11->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                     m_data.array[5] +
             fVar2 * (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.
                     m_data.array[3] +
             local_c4 *
             (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[4] +
             local_7c *
             (l12->super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>).m_storage.m_data.
             array[5] +
             fVar8 * fVar18 * (float)local_78._0_4_ +
             local_c4 * fVar6 * local_b4 * fVar17 +
             fVar12 * local_c4 * fVar6 * (float)local_98._0_4_ +
             local_b0 * fVar8 * local_b8 +
             fVar21 * fVar18 * fVar4 +
             local_7c * fVar6 * fVar3 * fVar17 +
             fVar12 * local_7c * fVar6 * local_80 +
             local_ac * fVar21 * local_b8 +
             fVar2 * fVar5 * fVar18 * (float)local_78._0_4_ +
             fVar9 * local_b4 * fVar17 +
             fVar12 * fVar9 * (float)local_98._0_4_ +
             local_b0 * fVar2 * fVar5 * local_b8 +
             fVar7 * local_b4 * fVar4 +
             fVar5 * local_7c * fVar3 * (float)local_78._0_4_ +
             local_b0 * fVar5 * local_7c * local_80 +
             local_ac * fVar7 * (float)local_98._0_4_ +
             fVar1 * fVar2 * fVar18 * fVar4 +
             fVar3 * fVar11 * fVar17 +
             fVar11 * fVar12 * local_80 +
             local_ac * fVar1 * fVar2 * local_b8 +
             fVar1 * local_c4 * local_b4 * fVar4 +
             fVar20 * fVar3 * (float)local_78._0_4_ +
             fVar1 * local_c4 * local_ac * (float)local_98._0_4_ + fVar20 * local_b0 * local_80;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(c2,&local_c8);
  return;
}

Assistant:

void fillRow1(const Eigen::Matrix<floatPrec,6,1> & l01,
    const Eigen::Matrix<floatPrec,6,1> & l02,
    const Eigen::Matrix<floatPrec,6,1> & l11,
    const Eigen::Matrix<floatPrec,6,1> & l12,
    std::vector<floatPrec> & c0,
    std::vector<floatPrec> & c1,
    std::vector<floatPrec> & c2 )
{
  c0.push_back(-l12[2]*l11[1]*l01[0]+l12[2]*l11[0]*l01[1]+l12[1]*l11[2]*l01[0]-l12[1]*l11[0]*l01[2]+l12[0]*l11[2]*l01[1]-l12[0]*l11[1]*l01[2]);
  c0.push_back(2*l12[1]*l11[2]*l01[1]-2*l12[1]*l11[1]*l01[2]-2*l12[0]*l11[2]*l01[0]+2*l12[0]*l11[0]*l01[2]);
  c0.push_back(-l12[2]*l11[1]*l01[0]+l12[2]*l11[0]*l01[1]-l12[1]*l11[2]*l01[0]+l12[1]*l11[0]*l01[2]-l12[0]*l11[2]*l01[1]+l12[0]*l11[1]*l01[2]);
  c0.push_back(2*l12[2]*l11[2]*l01[1]-2*l12[2]*l11[1]*l01[2]+2*l12[0]*l11[1]*l01[0]-2*l12[0]*l11[0]*l01[1]);
  c0.push_back(-2*l12[2]*l11[2]*l01[0]+2*l12[2]*l11[0]*l01[2]+2*l12[1]*l11[1]*l01[0]-2*l12[1]*l11[0]*l01[1]);
  c0.push_back(l12[2]*l11[1]*l01[0]-l12[2]*l11[0]*l01[1]+l12[1]*l11[2]*l01[0]-l12[1]*l11[0]*l01[2]-l12[0]*l11[2]*l01[1]+l12[0]*l11[1]*l01[2]);
  c0.push_back(-2*l12[2]*l11[2]*l01[0]+2*l12[2]*l11[0]*l01[2]-2*l12[1]*l11[1]*l01[0]+2*l12[1]*l11[0]*l01[1]);
  c0.push_back(-2*l12[2]*l11[2]*l01[1]+2*l12[2]*l11[1]*l01[2]+2*l12[0]*l11[1]*l01[0]-2*l12[0]*l11[0]*l01[1]);
  c0.push_back(2*l12[1]*l11[2]*l01[1]-2*l12[1]*l11[1]*l01[2]+2*l12[0]*l11[2]*l01[0]-2*l12[0]*l11[0]*l01[2]);
  c0.push_back(l12[2]*l11[1]*l01[0]-l12[2]*l11[0]*l01[1]-l12[1]*l11[2]*l01[0]+l12[1]*l11[0]*l01[2]+l12[0]*l11[2]*l01[1]-l12[0]*l11[1]*l01[2]);
  c1.push_back(l12[2]*l11[1]*l02[0]+l12[2]*l11[0]*l02[1]-l12[1]*l11[2]*l02[0]-l12[1]*l11[0]*l02[2]+l12[0]*l11[2]*l02[1]-l12[0]*l11[1]*l02[2]);
  c1.push_back(2*l12[2]*l11[1]*l02[1]-2*l12[2]*l11[0]*l02[0]-2*l12[1]*l11[1]*l02[2]+2*l12[0]*l11[0]*l02[2]);
  c1.push_back(-l12[2]*l11[1]*l02[0]-l12[2]*l11[0]*l02[1]-l12[1]*l11[2]*l02[0]+l12[1]*l11[0]*l02[2]+l12[0]*l11[2]*l02[1]+l12[0]*l11[1]*l02[2]);
  c1.push_back(2*l12[2]*l11[2]*l02[1]-2*l12[1]*l11[2]*l02[2]+2*l12[1]*l11[0]*l02[0]-2*l12[0]*l11[0]*l02[1]);
  c1.push_back(-2*l12[2]*l11[2]*l02[0]+2*l12[1]*l11[1]*l02[0]+2*l12[0]*l11[2]*l02[2]-2*l12[0]*l11[1]*l02[1]);
  c1.push_back(l12[2]*l11[1]*l02[0]-l12[2]*l11[0]*l02[1]+l12[1]*l11[2]*l02[0]+l12[1]*l11[0]*l02[2]-l12[0]*l11[2]*l02[1]-l12[0]*l11[1]*l02[2]);
  c1.push_back(2*l12[2]*l11[2]*l02[0]+2*l12[1]*l11[1]*l02[0]-2*l12[0]*l11[2]*l02[2]-2*l12[0]*l11[1]*l02[1]);
  c1.push_back(2*l12[2]*l11[2]*l02[1]-2*l12[1]*l11[2]*l02[2]-2*l12[1]*l11[0]*l02[0]+2*l12[0]*l11[0]*l02[1]);
  c1.push_back(-2*l12[2]*l11[1]*l02[1]-2*l12[2]*l11[0]*l02[0]+2*l12[1]*l11[1]*l02[2]+2*l12[0]*l11[0]*l02[2]);
  c1.push_back(-l12[2]*l11[1]*l02[0]+l12[2]*l11[0]*l02[1]+l12[1]*l11[2]*l02[0]-l12[1]*l11[0]*l02[2]-l12[0]*l11[2]*l02[1]+l12[0]*l11[1]*l02[2]);
  c2.push_back(-l12[2]*l11[1]*l02[5]*l02[1]+l12[2]*l11[1]*l02[4]*l02[2]+l12[2]*l11[1]*l01[5]*l01[1]-l12[2]*l11[1]*l01[4]*l01[2]+l12[2]*l11[0]*l02[5]*l02[0]-l12[2]*l11[0]*l02[3]*l02[2]+l12[2]*l11[0]*l01[5]*l01[0]-l12[2]*l11[0]*l01[3]*l01[2]+l12[1]*l11[2]*l02[5]*l02[1]-l12[1]*l11[2]*l02[4]*l02[2]-l12[1]*l11[2]*l01[5]*l01[1]+l12[1]*l11[2]*l01[4]*l01[2]+l12[1]*l11[0]*l02[4]*l02[0]-l12[1]*l11[0]*l02[3]*l02[1]+l12[1]*l11[0]*l01[4]*l01[0]-l12[1]*l11[0]*l01[3]*l01[1]+l12[0]*l11[2]*l02[5]*l02[0]-l12[0]*l11[2]*l02[3]*l02[2]+l12[0]*l11[2]*l01[5]*l01[0]-l12[0]*l11[2]*l01[3]*l01[2]+l12[0]*l11[1]*l02[4]*l02[0]-l12[0]*l11[1]*l02[3]*l02[1]+l12[0]*l11[1]*l01[4]*l01[0]-l12[0]*l11[1]*l01[3]*l01[1]-l12[5]*l11[2]-l12[4]*l11[1]+l12[3]*l11[0]-l12[2]*l11[5]-l12[1]*l11[4]+l12[0]*l11[3]);
  c2.push_back(2*l12[2]*l11[1]*l02[5]*l02[0]-2*l12[2]*l11[1]*l02[3]*l02[2]+2*l12[2]*l11[0]*l02[5]*l02[1]-2*l12[2]*l11[0]*l02[4]*l02[2]+2*l12[1]*l11[2]*l01[5]*l01[0]-2*l12[1]*l11[2]*l01[3]*l01[2]+2*l12[1]*l11[1]*l02[4]*l02[0]-2*l12[1]*l11[1]*l02[3]*l02[1]+2*l12[1]*l11[1]*l01[4]*l01[0]-2*l12[1]*l11[1]*l01[3]*l01[1]+2*l12[0]*l11[2]*l01[5]*l01[1]-2*l12[0]*l11[2]*l01[4]*l01[2]-2*l12[0]*l11[0]*l02[4]*l02[0]+2*l12[0]*l11[0]*l02[3]*l02[1]-2*l12[0]*l11[0]*l01[4]*l01[0]+2*l12[0]*l11[0]*l01[3]*l01[1]+2*l12[4]*l11[0]+2*l12[3]*l11[1]+2*l12[1]*l11[3]+2*l12[0]*l11[4]);
  c2.push_back(l12[2]*l11[1]*l02[5]*l02[1]-l12[2]*l11[1]*l02[4]*l02[2]+l12[2]*l11[1]*l01[5]*l01[1]-l12[2]*l11[1]*l01[4]*l01[2]-l12[2]*l11[0]*l02[5]*l02[0]+l12[2]*l11[0]*l02[3]*l02[2]+l12[2]*l11[0]*l01[5]*l01[0]-l12[2]*l11[0]*l01[3]*l01[2]+l12[1]*l11[2]*l02[5]*l02[1]-l12[1]*l11[2]*l02[4]*l02[2]+l12[1]*l11[2]*l01[5]*l01[1]-l12[1]*l11[2]*l01[4]*l01[2]-l12[1]*l11[0]*l02[4]*l02[0]+l12[1]*l11[0]*l02[3]*l02[1]-l12[1]*l11[0]*l01[4]*l01[0]+l12[1]*l11[0]*l01[3]*l01[1]+l12[0]*l11[2]*l02[5]*l02[0]-l12[0]*l11[2]*l02[3]*l02[2]-l12[0]*l11[2]*l01[5]*l01[0]+l12[0]*l11[2]*l01[3]*l01[2]-l12[0]*l11[1]*l02[4]*l02[0]+l12[0]*l11[1]*l02[3]*l02[1]-l12[0]*l11[1]*l01[4]*l01[0]+l12[0]*l11[1]*l01[3]*l01[1]-l12[5]*l11[2]+l12[4]*l11[1]-l12[3]*l11[0]-l12[2]*l11[5]+l12[1]*l11[4]-l12[0]*l11[3]);
  c2.push_back(2*l12[2]*l11[2]*l02[5]*l02[0]-2*l12[2]*l11[2]*l02[3]*l02[2]+2*l12[2]*l11[2]*l01[5]*l01[0]-2*l12[2]*l11[2]*l01[3]*l01[2]+2*l12[2]*l11[1]*l01[4]*l01[0]-2*l12[2]*l11[1]*l01[3]*l01[1]+2*l12[1]*l11[2]*l02[4]*l02[0]-2*l12[1]*l11[2]*l02[3]*l02[1]-2*l12[1]*l11[0]*l02[5]*l02[1]+2*l12[1]*l11[0]*l02[4]*l02[2]-2*l12[0]*l11[1]*l01[5]*l01[1]+2*l12[0]*l11[1]*l01[4]*l01[2]-2*l12[0]*l11[0]*l02[5]*l02[0]+2*l12[0]*l11[0]*l02[3]*l02[2]-2*l12[0]*l11[0]*l01[5]*l01[0]+2*l12[0]*l11[0]*l01[3]*l01[2]+2*l12[5]*l11[0]+2*l12[3]*l11[2]+2*l12[2]*l11[3]+2*l12[0]*l11[5]);
  c2.push_back(2*l12[2]*l11[2]*l02[5]*l02[1]-2*l12[2]*l11[2]*l02[4]*l02[2]+2*l12[2]*l11[2]*l01[5]*l01[1]-2*l12[2]*l11[2]*l01[4]*l01[2]-2*l12[2]*l11[0]*l01[4]*l01[0]+2*l12[2]*l11[0]*l01[3]*l01[1]-2*l12[1]*l11[1]*l02[5]*l02[1]+2*l12[1]*l11[1]*l02[4]*l02[2]-2*l12[1]*l11[1]*l01[5]*l01[1]+2*l12[1]*l11[1]*l01[4]*l01[2]-2*l12[1]*l11[0]*l01[5]*l01[0]+2*l12[1]*l11[0]*l01[3]*l01[2]-2*l12[0]*l11[2]*l02[4]*l02[0]+2*l12[0]*l11[2]*l02[3]*l02[1]-2*l12[0]*l11[1]*l02[5]*l02[0]+2*l12[0]*l11[1]*l02[3]*l02[2]+2*l12[5]*l11[1]+2*l12[4]*l11[2]+2*l12[2]*l11[4]+2*l12[1]*l11[5]);
  c2.push_back(-l12[2]*l11[1]*l02[5]*l02[1]+l12[2]*l11[1]*l02[4]*l02[2]-l12[2]*l11[1]*l01[5]*l01[1]+l12[2]*l11[1]*l01[4]*l01[2]-l12[2]*l11[0]*l02[5]*l02[0]+l12[2]*l11[0]*l02[3]*l02[2]-l12[2]*l11[0]*l01[5]*l01[0]+l12[2]*l11[0]*l01[3]*l01[2]-l12[1]*l11[2]*l02[5]*l02[1]+l12[1]*l11[2]*l02[4]*l02[2]-l12[1]*l11[2]*l01[5]*l01[1]+l12[1]*l11[2]*l01[4]*l01[2]-l12[1]*l11[0]*l02[4]*l02[0]+l12[1]*l11[0]*l02[3]*l02[1]+l12[1]*l11[0]*l01[4]*l01[0]-l12[1]*l11[0]*l01[3]*l01[1]-l12[0]*l11[2]*l02[5]*l02[0]+l12[0]*l11[2]*l02[3]*l02[2]-l12[0]*l11[2]*l01[5]*l01[0]+l12[0]*l11[2]*l01[3]*l01[2]+l12[0]*l11[1]*l02[4]*l02[0]-l12[0]*l11[1]*l02[3]*l02[1]-l12[0]*l11[1]*l01[4]*l01[0]+l12[0]*l11[1]*l01[3]*l01[1]+l12[5]*l11[2]-l12[4]*l11[1]-l12[3]*l11[0]+l12[2]*l11[5]-l12[1]*l11[4]-l12[0]*l11[3]);
  c2.push_back(-2*l12[2]*l11[2]*l02[5]*l02[1]+2*l12[2]*l11[2]*l02[4]*l02[2]+2*l12[2]*l11[2]*l01[5]*l01[1]-2*l12[2]*l11[2]*l01[4]*l01[2]-2*l12[2]*l11[0]*l01[4]*l01[0]+2*l12[2]*l11[0]*l01[3]*l01[1]-2*l12[1]*l11[1]*l02[5]*l02[1]+2*l12[1]*l11[1]*l02[4]*l02[2]+2*l12[1]*l11[1]*l01[5]*l01[1]-2*l12[1]*l11[1]*l01[4]*l01[2]+2*l12[1]*l11[0]*l01[5]*l01[0]-2*l12[1]*l11[0]*l01[3]*l01[2]+2*l12[0]*l11[2]*l02[4]*l02[0]-2*l12[0]*l11[2]*l02[3]*l02[1]-2*l12[0]*l11[1]*l02[5]*l02[0]+2*l12[0]*l11[1]*l02[3]*l02[2]+2*l12[5]*l11[1]-2*l12[4]*l11[2]+2*l12[2]*l11[4]-2*l12[1]*l11[5]);
  c2.push_back(2*l12[2]*l11[2]*l02[5]*l02[0]-2*l12[2]*l11[2]*l02[3]*l02[2]-2*l12[2]*l11[2]*l01[5]*l01[0]+2*l12[2]*l11[2]*l01[3]*l01[2]-2*l12[2]*l11[1]*l01[4]*l01[0]+2*l12[2]*l11[1]*l01[3]*l01[1]+2*l12[1]*l11[2]*l02[4]*l02[0]-2*l12[1]*l11[2]*l02[3]*l02[1]+2*l12[1]*l11[0]*l02[5]*l02[1]-2*l12[1]*l11[0]*l02[4]*l02[2]-2*l12[0]*l11[1]*l01[5]*l01[1]+2*l12[0]*l11[1]*l01[4]*l01[2]+2*l12[0]*l11[0]*l02[5]*l02[0]-2*l12[0]*l11[0]*l02[3]*l02[2]-2*l12[0]*l11[0]*l01[5]*l01[0]+2*l12[0]*l11[0]*l01[3]*l01[2]-2*l12[5]*l11[0]+2*l12[3]*l11[2]-2*l12[2]*l11[3]+2*l12[0]*l11[5]);
  c2.push_back(-2*l12[2]*l11[1]*l02[5]*l02[0]+2*l12[2]*l11[1]*l02[3]*l02[2]+2*l12[2]*l11[0]*l02[5]*l02[1]-2*l12[2]*l11[0]*l02[4]*l02[2]+2*l12[1]*l11[2]*l01[5]*l01[0]-2*l12[1]*l11[2]*l01[3]*l01[2]-2*l12[1]*l11[1]*l02[4]*l02[0]+2*l12[1]*l11[1]*l02[3]*l02[1]+2*l12[1]*l11[1]*l01[4]*l01[0]-2*l12[1]*l11[1]*l01[3]*l01[1]-2*l12[0]*l11[2]*l01[5]*l01[1]+2*l12[0]*l11[2]*l01[4]*l01[2]-2*l12[0]*l11[0]*l02[4]*l02[0]+2*l12[0]*l11[0]*l02[3]*l02[1]+2*l12[0]*l11[0]*l01[4]*l01[0]-2*l12[0]*l11[0]*l01[3]*l01[1]+2*l12[4]*l11[0]-2*l12[3]*l11[1]+2*l12[1]*l11[3]-2*l12[0]*l11[4]);
  c2.push_back(l12[2]*l11[1]*l02[5]*l02[1]-l12[2]*l11[1]*l02[4]*l02[2]-l12[2]*l11[1]*l01[5]*l01[1]+l12[2]*l11[1]*l01[4]*l01[2]+l12[2]*l11[0]*l02[5]*l02[0]-l12[2]*l11[0]*l02[3]*l02[2]-l12[2]*l11[0]*l01[5]*l01[0]+l12[2]*l11[0]*l01[3]*l01[2]-l12[1]*l11[2]*l02[5]*l02[1]+l12[1]*l11[2]*l02[4]*l02[2]+l12[1]*l11[2]*l01[5]*l01[1]-l12[1]*l11[2]*l01[4]*l01[2]+l12[1]*l11[0]*l02[4]*l02[0]-l12[1]*l11[0]*l02[3]*l02[1]-l12[1]*l11[0]*l01[4]*l01[0]+l12[1]*l11[0]*l01[3]*l01[1]-l12[0]*l11[2]*l02[5]*l02[0]+l12[0]*l11[2]*l02[3]*l02[2]+l12[0]*l11[2]*l01[5]*l01[0]-l12[0]*l11[2]*l01[3]*l01[2]-l12[0]*l11[1]*l02[4]*l02[0]+l12[0]*l11[1]*l02[3]*l02[1]+l12[0]*l11[1]*l01[4]*l01[0]-l12[0]*l11[1]*l01[3]*l01[1]+l12[5]*l11[2]+l12[4]*l11[1]+l12[3]*l11[0]+l12[2]*l11[5]+l12[1]*l11[4]+l12[0]*l11[3]);
}